

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.h
# Opt level: O0

void clear_catalog(catalog_t *catalog)

{
  catalog_t *catalog_local;
  
  if (catalog->objects != (object_entry_t *)0x0) {
    free(catalog->objects);
  }
  if (catalog->enums != (enum_entry_t *)0x0) {
    free(catalog->enums);
  }
  if (catalog->services != (service_entry_t *)0x0) {
    free(catalog->services);
  }
  if (catalog->name_table != (char *)0x0) {
    free(catalog->name_table);
  }
  memset(catalog,0,0x60);
  return;
}

Assistant:

static void clear_catalog(catalog_t *catalog)
{
    if (catalog->objects) {
        free(catalog->objects);
    }
    if (catalog->enums) {
        free(catalog->enums);
    }
    if (catalog->services) {
        free(catalog->services);
    }
    if (catalog->name_table) {
        free(catalog->name_table);
    }
    memset(catalog, 0, sizeof(*catalog));
}